

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O1

void __thiscall imrt::Station::initializeStation(Station *this,int type,int open_apertures)

{
  pointer pdVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  int iVar5;
  pair<int,_int> pVar6;
  int j_1;
  int j;
  int iVar7;
  int j_3;
  long lVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> aux;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_58;
  pair<int,_int> local_40;
  uint local_34;
  long lVar14;
  
  local_34 = type;
  if ((uint)type < 2) {
    if (0 < this->max_apertures) {
      lVar8 = 0;
      do {
        local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pair<int,_int> *)0x0;
        local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<int,_int> *)0x0;
        for (iVar7 = 0; iVar4 = Collimator::getXdim(this->collimator), iVar7 < iVar4;
            iVar7 = iVar7 + 1) {
          local_40 = Collimator::getActiveRange(this->collimator,iVar7,this->angle);
          if (local_58.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish ==
              local_58.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                       (iterator)
                       local_58.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_40);
          }
          else {
            *local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish = local_40;
            local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_58.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                  ((this->A).
                   super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar8,&local_58);
        if (local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < this->max_apertures);
    }
  }
  else if ((type & 0xfffffffeU) == 2) {
    if (0 < this->max_apertures) {
      lVar8 = 0;
      do {
        local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pair<int,_int> *)0x0;
        local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<int,_int> *)0x0;
        for (iVar7 = 0; iVar4 = Collimator::getXdim(this->collimator), iVar7 < iVar4;
            iVar7 = iVar7 + 1) {
          local_40.first = -1;
          local_40.second = -1;
          if (local_58.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish ==
              local_58.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                       (iterator)
                       local_58.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_40);
          }
          else {
            (local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->first = -1;
            (local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->second = -1;
            local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_58.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                  ((this->A).
                   super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar8,&local_58);
        if (local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < this->max_apertures);
    }
  }
  else if (type == 4) {
    if (0 < this->max_apertures) {
      lVar8 = 0;
      do {
        local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pair<int,_int> *)0x0;
        local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<int,_int> *)0x0;
        for (iVar7 = 0; iVar4 = Collimator::getXdim(this->collimator), iVar7 < iVar4;
            iVar7 = iVar7 + 1) {
          pVar6 = Collimator::getActiveRange(this->collimator,iVar7,this->angle);
          iVar4 = pVar6.first;
          if (iVar4 < 0) {
            local_40.first = -1;
            local_40.second = -1;
            if (local_58.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                local_58.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              (local_58.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->first = -1;
              (local_58.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->second = -1;
              goto LAB_001144ea;
            }
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                       (iterator)
                       local_58.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_40);
          }
          else {
            iVar5 = rand();
            iVar9 = pVar6.second;
            iVar4 = iVar5 % ((iVar9 - iVar4) + 1) + iVar4;
            if (iVar4 == iVar9) {
              local_40 = (pair<int,_int>)((ulong)pVar6 & 0xffffffff00000000 | (ulong)pVar6 >> 0x20);
              if (local_58.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_58.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                _M_realloc_insert<std::pair<int,int>>
                          ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                           &local_58,
                           (iterator)
                           local_58.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_40);
              }
              else {
                *local_58.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish = local_40;
LAB_001144ea:
                local_58.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_58.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            else {
              iVar5 = rand();
              local_40.second = iVar5 % ((iVar9 - iVar4) + 1) + iVar4;
              local_40.first = iVar4;
              if (local_58.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  local_58.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                *local_58.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish = local_40;
                goto LAB_001144ea;
              }
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                         (iterator)
                         local_58.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_40);
            }
          }
        }
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                  ((this->A).
                   super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar8,&local_58);
        if (local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < this->max_apertures);
    }
  }
  else if (0 < this->max_apertures) {
    lVar8 = 0;
    do {
      local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pair<int,_int> *)0x0;
      local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<int,_int> *)0x0;
      for (iVar7 = 0; iVar4 = Collimator::getXdim(this->collimator), iVar7 < iVar4;
          iVar7 = iVar7 + 1) {
        if (open_apertures < 1) {
          local_40.first = -1;
          local_40.second = -1;
          if (local_58.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish !=
              local_58.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            (local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->first = -1;
            (local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->second = -1;
            goto LAB_001145e0;
          }
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          _M_realloc_insert<std::pair<int,int>>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                     (iterator)
                     local_58.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_40);
        }
        else {
          local_40 = Collimator::getActiveRange(this->collimator,iVar7,this->angle);
          if (local_58.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish ==
              local_58.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                       (iterator)
                       local_58.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_40);
          }
          else {
            *local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish = local_40;
LAB_001145e0:
            local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_58.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                ((this->A).
                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar8,&local_58);
      if (local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      open_apertures = open_apertures + -1;
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->max_apertures);
  }
  uVar3 = local_34;
  auVar2 = _DAT_00123b20;
  if ((local_34 & 0xfffffffd) == 0) {
    iVar7 = this->max_apertures;
    if (0 < (long)iVar7) {
      iVar4 = this->min_intensity;
      pdVar1 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = (long)iVar7 + -1;
      auVar11._8_4_ = (int)lVar8;
      auVar11._0_8_ = lVar8;
      auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
      lVar8 = 0;
      auVar11 = auVar11 ^ _DAT_00123b20;
      auVar15 = _DAT_00123b10;
      do {
        auVar16 = auVar15 ^ auVar2;
        if ((bool)(~(auVar16._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar16._0_4_ ||
                    auVar11._4_4_ < auVar16._4_4_) & 1)) {
          *(double *)((long)pdVar1 + lVar8) = (double)iVar4;
        }
        if ((auVar16._12_4_ != auVar11._12_4_ || auVar16._8_4_ <= auVar11._8_4_) &&
            auVar16._12_4_ <= auVar11._12_4_) {
          *(double *)((long)pdVar1 + lVar8 + 8) = (double)iVar4;
        }
        lVar14 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 2;
        auVar15._8_8_ = lVar14 + 2;
        lVar8 = lVar8 + 0x10;
      } while ((ulong)(iVar7 + 1U >> 1) << 4 != lVar8);
    }
  }
  else if ((local_34 & 0xfffffffd) == 1) {
    iVar7 = this->max_apertures;
    if (0 < (long)iVar7) {
      iVar4 = this->max_intensity;
      pdVar1 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = (long)iVar7 + -1;
      auVar10._8_4_ = (int)lVar8;
      auVar10._0_8_ = lVar8;
      auVar10._12_4_ = (int)((ulong)lVar8 >> 0x20);
      lVar8 = 0;
      auVar10 = auVar10 ^ _DAT_00123b20;
      auVar13 = _DAT_00123b10;
      do {
        auVar15 = auVar13 ^ auVar2;
        if ((bool)(~(auVar15._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar15._0_4_ ||
                    auVar10._4_4_ < auVar15._4_4_) & 1)) {
          *(double *)((long)pdVar1 + lVar8) = (double)iVar4;
        }
        if ((auVar15._12_4_ != auVar10._12_4_ || auVar15._8_4_ <= auVar10._8_4_) &&
            auVar15._12_4_ <= auVar10._12_4_) {
          *(double *)((long)pdVar1 + lVar8 + 8) = (double)iVar4;
        }
        lVar14 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 2;
        auVar13._8_8_ = lVar14 + 2;
        lVar8 = lVar8 + 0x10;
      } while ((ulong)(iVar7 + 1U >> 1) << 4 != lVar8);
    }
  }
  else if (local_34 == 4) {
    local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pair<int,_int> *)0x0;
    local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pair<int,_int> *)0x0;
    local_40 = (pair<int,_int>)((ulong)local_40 & 0xffffffff00000000);
    if (-1 < this->max_intensity) {
      iVar7 = 0;
      do {
        if (local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_58,
                     (iterator)
                     local_58.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_40.first);
        }
        else {
          (local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish)->first = iVar7;
          local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)local_58.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 4);
        }
        iVar7 = this->step_intensity + local_40.first;
        local_40.first = iVar7;
      } while (iVar7 <= this->max_intensity);
    }
    if (0 < this->max_apertures) {
      lVar8 = 0;
      do {
        iVar7 = rand();
        (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar8] =
             (double)(&(local_58.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first)
                     [(int)((ulong)(long)iVar7 %
                           (((long)local_58.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_58.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 2) + 1U))];
        lVar8 = lVar8 + 1;
      } while (lVar8 < this->max_apertures);
    }
    if (local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    iVar7 = this->max_apertures;
    if (0 < (long)iVar7) {
      iVar4 = this->initial_intensity;
      pdVar1 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = (long)iVar7 + -1;
      auVar12._8_4_ = (int)lVar8;
      auVar12._0_8_ = lVar8;
      auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
      lVar8 = 0;
      auVar12 = auVar12 ^ _DAT_00123b20;
      auVar16 = _DAT_00123b10;
      do {
        auVar15 = auVar16 ^ auVar2;
        if ((bool)(~(auVar15._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar15._0_4_ ||
                    auVar12._4_4_ < auVar15._4_4_) & 1)) {
          *(double *)((long)pdVar1 + lVar8) = (double)iVar4;
        }
        if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
            auVar15._12_4_ <= auVar12._12_4_) {
          *(double *)((long)pdVar1 + lVar8 + 8) = (double)iVar4;
        }
        lVar14 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 2;
        auVar16._8_8_ = lVar14 + 2;
        lVar8 = lVar8 + 0x10;
      } while ((ulong)(iVar7 + 1U >> 1) << 4 != lVar8);
    }
  }
  if (uVar3 == 5) {
    generate_random_intensities(this);
  }
  else {
    generateIntensity(this);
  }
  return;
}

Assistant:

void Station::initializeStation(int type, int open_apertures) {
    // Generating aperture patterns


    if (type==OPEN_MAX_SETUP || type==OPEN_MIN_SETUP) {
      for (int i=0; i<max_apertures; i++) {
        vector<pair<int,int> > aux;
        for (int j=0; j<collimator.getXdim(); j++){
          aux.push_back(collimator.getActiveRange(j,angle));
        }
	      A[i] =aux;
      }
    } else if (type==CLOSED_MAX_SETUP || type==CLOSED_MIN_SETUP) {
      for (int i=0; i<max_apertures; i++){
        vector<pair<int,int> > aux;
        for (int j=0; j<collimator.getXdim(); j++)
          aux.push_back(make_pair(-1,-1));
        A[i] = aux;
      }
    } else if (type==RAND_RAND_SETUP) {
      for (int i=0; i<max_apertures; i++) {
        vector<pair<int,int> > aux;
        for (int j=0; j<collimator.getXdim(); j++) {
          pair<int, int> range = collimator.getActiveRange(j,angle);
          if (range.first<0) {
            aux.push_back(make_pair(-1,-1));
            continue;
          }
          int index1 = range.first + rand() % (range.second-range.first+1);
          if (index1 == range.second) {
            aux.push_back(make_pair(range.second,range.second));
          } else {
            int index2 = index1 + rand() % (range.second-index1+1);
            aux.push_back(make_pair(index1,index2));
          }
        }
        A[i]=aux;
      }
    } else {
      //Keeping this for backwards compatibility
      for (int i=0; i<max_apertures; i++) {
        vector<pair<int,int> > aux;
        for (int j=0; j<collimator.getXdim(); j++) {
          if (open_apertures>0)
            aux.push_back(collimator.getActiveRange(j,angle));
          else
            aux.push_back(make_pair(-1,-1));
        }
        open_apertures--;
        A[i]=aux;
      }
    }

    // Generating intensity
    if (type==OPEN_MIN_SETUP || type==CLOSED_MIN_SETUP) {
      for (int i=0; i<max_apertures; i++)
        intensity[i] = min_intensity;
    } else if (type==OPEN_MAX_SETUP || type==CLOSED_MAX_SETUP) {
      for (int i=0; i<max_apertures; i++)
        intensity[i] = max_intensity;
    } else if (type==RAND_RAND_SETUP) {
      vector<int> levels;
      for (int k=0; k<=max_intensity; k=k+step_intensity)
        levels.push_back(k);
      int sel;
      for (int i=0; i<max_apertures; i++) {
        sel = (rand() %  (levels.size()+1));
        intensity[i] = levels[sel];
      }
    } else {
      for (int i=0; i<max_apertures; i++)
        intensity[i] = initial_intensity;
    }

    if(type==RAND_INTENSITIES)
      generate_random_intensities();
    else
      generateIntensity();
  }